

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void makelabel(int tabindex,char *label)

{
  int iVar1;
  bool bVar2;
  symboltype sVar3;
  datatype dVar4;
  size_t sVar5;
  char local_29 [5];
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char indexstr [5];
  int k;
  int j;
  int i;
  char *label_local;
  int tabindex_local;
  
  *label = '\0';
  sVar3 = symclass(tabindex);
  switch(sVar3) {
  case stprogram:
  case stparameter:
  case stvariable:
  case stprocedure:
    iVar1 = symtab[tabindex].thisname;
    cStack_24 = '\0';
    cStack_23 = '\0';
    cStack_22 = '\0';
    indexstr[0] = '\0';
    indexstr._1_4_ = nametable[iVar1].strstart;
    while( true ) {
      bVar2 = false;
      if ((int)indexstr._1_4_ < nametable[iVar1].strstart + nametable[iVar1].strlength) {
        bVar2 = (int)indexstr._1_4_ < nametable[iVar1].strstart + 5;
      }
      if (!bVar2) break;
      label[_cStack_24] = stringtable[(int)indexstr._1_4_];
      indexstr._1_4_ = indexstr._1_4_ + 1;
      _cStack_24 = _cStack_24 + 1;
    }
    label[_cStack_24] = '\0';
    sVar5 = strlen(label);
    if (4 < sVar5) {
      sprintf(local_29,"%d",(ulong)(uint)tabindex);
      strcat(label,local_29);
    }
  default:
    break;
  case stlabel:
    strcpy(label,"_loop");
    sprintf(local_29,"%d",(ulong)(uint)tabindex);
    strcat(label,local_29);
    break;
  case stliteral:
    dVar4 = data_class(tabindex);
    if (dVar4 == dtinteger) {
      iVar1 = symtab[tabindex].thisname;
      cStack_24 = '\0';
      cStack_23 = '\0';
      cStack_22 = '\0';
      indexstr[0] = '\0';
      for (indexstr._1_4_ = nametable[iVar1].strstart;
          (int)indexstr._1_4_ < nametable[iVar1].strstart + nametable[iVar1].strlength;
          indexstr._1_4_ = indexstr._1_4_ + 1) {
        label[_cStack_24] = stringtable[(int)indexstr._1_4_];
        _cStack_24 = _cStack_24 + 1;
      }
      label[_cStack_24] = '\0';
      break;
    }
  case sttempvar:
    *label = '_';
    label[1] = 't';
    label[2] = '\0';
    sprintf(local_29,"%d",(ulong)(uint)tabindex);
    strcat(label,local_29);
  }
  strcpy(symtab[tabindex].label,label);
  return;
}

Assistant:

void	makelabel(int tabindex, char *label)
{
    int		i, j, k;
    char		indexstr[5];
    
    label[0] = '\0';
    switch (symclass(tabindex))	{
        case stliteral:
            if (data_class(tabindex) == dtinteger)	{
                i = symtab[tabindex].thisname;
                
                for  (k = 0, j = nametable[i].strstart;
                      j < nametable[i].strstart+
                      nametable[i].strlength;
                      j++, k++)
                    label[k] = stringtable[j];
                label[k] = '\0';
                break;
            }
            
            
        case sttempvar:
            label[0] = '_';
            label[1] = 't';
            label[2] = '\0';
            //itoa(tabindex, indexstr, 10);
            sprintf(indexstr, "%d", tabindex);
            strcat(label, indexstr);
            break;
            
        case stlabel:
            strcpy(label, "_loop");
            //itoa(tabindex, indexstr, 10);
            sprintf(indexstr, "%d", tabindex);
            strcat(label, indexstr);
            break;
        case stprogram:
        case stvariable:
        case stparameter:
        case stprocedure:
            i = symtab[tabindex].thisname;
            
            for (k = 0, j = nametable[i].strstart; j < nametable[i].strstart+nametable[i].strlength && j < nametable[i].strstart+5; j++, k++)
                label[k] = stringtable[j];
            label[k] = '\0';
            if (strlen(label) >= 5)	{
                //itoa(tabindex, indexstr, 10);
                sprintf(indexstr, "%d", tabindex);
                strcat(label, indexstr);
            }
            
        default: break;
    }
    strcpy(symtab[tabindex].label, label);
    //printf("Tabindex is %d\n", tabindex);
}